

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::Bullet(void)

{
  bool bVar1;
  ImGuiWindowTempData *min;
  float fVar2;
  ImVec2 IVar3;
  ImRect bb;
  float line_height;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *in_stack_ffffffffffffff98;
  ImVec2 *this;
  ImRect *bb_00;
  ImVec2 in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  float in_stack_ffffffffffffffc4;
  float in_stack_ffffffffffffffc8;
  float fVar4;
  ImRect local_2c;
  float local_1c;
  ImGuiStyle *local_18;
  ImGuiContext *local_10;
  ImGuiWindow *local_8;
  
  local_8 = GetCurrentWindow();
  if ((local_8->SkipItems & 1U) == 0) {
    local_10 = GImGui;
    local_18 = &GImGui->Style;
    fVar2 = (GImGui->Style).FramePadding.y;
    fVar2 = ImMin<float>((local_8->DC).CurrentLineSize.y,fVar2 + fVar2 + GImGui->FontSize);
    local_1c = ImMax<float>(fVar2,local_10->FontSize);
    min = &local_8->DC;
    bb_00 = (ImRect *)&stack0xffffffffffffffc4;
    ImVec2::ImVec2((ImVec2 *)bb_00,local_10->FontSize,local_1c);
    IVar3 = operator+(in_stack_ffffffffffffff98,(ImVec2 *)0x17ed48);
    fVar2 = (float)((ulong)in_stack_ffffffffffffff98 >> 0x20);
    fVar4 = IVar3.x;
    ImRect::ImRect(&local_2c,&min->CursorPos,(ImVec2 *)&stack0xffffffffffffffcc);
    ItemSize(bb_00,fVar2);
    bVar1 = ItemAdd((ImRect *)CONCAT44(fVar4,in_stack_ffffffffffffffc8),
                    (ImGuiID)in_stack_ffffffffffffffc4,
                    (ImRect *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (bVar1) {
      this = (ImVec2 *)&stack0xffffffffffffffb4;
      ImVec2::ImVec2(this,local_10->FontSize * 0.5 + (local_18->FramePadding).x,local_1c * 0.5);
      operator+(this,(ImVec2 *)0x17edec);
      RenderBullet(in_stack_ffffffffffffffb0);
      SameLine((float)((ulong)bb_00 >> 0x20),SUB84(bb_00,0));
    }
    else {
      SameLine((float)((ulong)bb_00 >> 0x20),SUB84(bb_00,0));
    }
  }
  return;
}

Assistant:

void ImGui::Bullet()
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const float line_height = ImMax(ImMin(window->DC.CurrentLineSize.y, g.FontSize + g.Style.FramePadding.y*2), g.FontSize);
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(g.FontSize, line_height));
    ItemSize(bb);
    if (!ItemAdd(bb, 0))
    {
        SameLine(0, style.FramePadding.x*2);
        return;
    }

    // Render and stay on same line
    RenderBullet(bb.Min + ImVec2(style.FramePadding.x + g.FontSize*0.5f, line_height*0.5f));
    SameLine(0, style.FramePadding.x*2);
}